

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.cpp
# Opt level: O0

int stbi__process_scan_header(stbi__jpeg *z)

{
  byte bVar1;
  int iVar2;
  uint uVar3;
  long *in_RDI;
  int aa;
  int q;
  int which;
  int id;
  int Ls;
  int i;
  undefined4 in_stack_ffffffffffffffd8;
  uint in_stack_ffffffffffffffdc;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  int local_14;
  int local_4;
  
  iVar2 = stbi__get16be((stbi__context *)
                        CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0));
  bVar1 = stbi__get8((stbi__context *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8))
  ;
  *(uint *)((long)in_RDI + 0x4854) = (uint)bVar1;
  if (((*(int *)((long)in_RDI + 0x4854) < 1) || (4 < *(int *)((long)in_RDI + 0x4854))) ||
     (*(int *)(*in_RDI + 8) < *(int *)((long)in_RDI + 0x4854))) {
    local_4 = stbi__err("bad SOS component count");
  }
  else if (iVar2 == *(int *)((long)in_RDI + 0x4854) * 2 + 6) {
    for (local_14 = 0; local_14 < *(int *)((long)in_RDI + 0x4854); local_14 = local_14 + 1) {
      bVar1 = stbi__get8((stbi__context *)
                         CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
      uVar3 = (uint)bVar1;
      bVar1 = stbi__get8((stbi__context *)
                         CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
      in_stack_ffffffffffffffdc = (uint)bVar1;
      iVar2 = 0;
      while ((iVar2 < *(int *)(*in_RDI + 8) &&
             (*(uint *)(in_RDI + (long)iVar2 * 0xc + 0x8d4) != uVar3))) {
        iVar2 = iVar2 + 1;
      }
      if (iVar2 == *(int *)(*in_RDI + 8)) {
        return 0;
      }
      *(int *)(in_RDI + (long)iVar2 * 0xc + 0x8d6) = (int)in_stack_ffffffffffffffdc >> 4;
      if (3 < (int)in_RDI[(long)iVar2 * 0xc + 0x8d6]) {
        iVar2 = stbi__err("bad DC huff");
        return iVar2;
      }
      *(uint *)((long)in_RDI + (long)iVar2 * 0x60 + 0x46b4) = in_stack_ffffffffffffffdc & 0xf;
      if (3 < *(int *)((long)in_RDI + (long)iVar2 * 0x60 + 0x46b4)) {
        iVar2 = stbi__err("bad AC huff");
        return iVar2;
      }
      *(int *)((long)in_RDI + (long)local_14 * 4 + 0x4858) = iVar2;
    }
    bVar1 = stbi__get8((stbi__context *)
                       CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
    *(uint *)((long)in_RDI + 0x4834) = (uint)bVar1;
    bVar1 = stbi__get8((stbi__context *)
                       CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
    *(uint *)(in_RDI + 0x907) = (uint)bVar1;
    bVar1 = stbi__get8((stbi__context *)
                       CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
    *(int *)((long)in_RDI + 0x483c) = (int)(uint)bVar1 >> 4;
    *(uint *)(in_RDI + 0x908) = bVar1 & 0xf;
    if ((int)in_RDI[0x906] == 0) {
      if (*(int *)((long)in_RDI + 0x4834) != 0) {
        iVar2 = stbi__err("bad SOS");
        return iVar2;
      }
      if ((*(int *)((long)in_RDI + 0x483c) != 0) || ((int)in_RDI[0x908] != 0)) {
        iVar2 = stbi__err("bad SOS");
        return iVar2;
      }
      *(undefined4 *)(in_RDI + 0x907) = 0x3f;
    }
    else if ((((0x3f < *(int *)((long)in_RDI + 0x4834)) || (0x3f < (int)in_RDI[0x907])) ||
             ((int)in_RDI[0x907] < *(int *)((long)in_RDI + 0x4834))) ||
            ((0xd < *(int *)((long)in_RDI + 0x483c) || (0xd < (int)in_RDI[0x908])))) {
      iVar2 = stbi__err("bad SOS");
      return iVar2;
    }
    local_4 = 1;
  }
  else {
    local_4 = stbi__err("bad SOS len");
  }
  return local_4;
}

Assistant:

static int stbi__process_scan_header(stbi__jpeg *z)
{
   int i;
   int Ls = stbi__get16be(z->s);
   z->scan_n = stbi__get8(z->s);
   if (z->scan_n < 1 || z->scan_n > 4 || z->scan_n > (int) z->s->img_n) return stbi__err("bad SOS component count","Corrupt JPEG");
   if (Ls != 6+2*z->scan_n) return stbi__err("bad SOS len","Corrupt JPEG");
   for (i=0; i < z->scan_n; ++i) {
      int id = stbi__get8(z->s), which;
      int q = stbi__get8(z->s);
      for (which = 0; which < z->s->img_n; ++which)
         if (z->img_comp[which].id == id)
            break;
      if (which == z->s->img_n) return 0; // no match
      z->img_comp[which].hd = q >> 4;   if (z->img_comp[which].hd > 3) return stbi__err("bad DC huff","Corrupt JPEG");
      z->img_comp[which].ha = q & 15;   if (z->img_comp[which].ha > 3) return stbi__err("bad AC huff","Corrupt JPEG");
      z->order[i] = which;
   }

   {
      int aa;
      z->spec_start = stbi__get8(z->s);
      z->spec_end   = stbi__get8(z->s); // should be 63, but might be 0
      aa = stbi__get8(z->s);
      z->succ_high = (aa >> 4);
      z->succ_low  = (aa & 15);
      if (z->progressive) {
         if (z->spec_start > 63 || z->spec_end > 63  || z->spec_start > z->spec_end || z->succ_high > 13 || z->succ_low > 13)
            return stbi__err("bad SOS", "Corrupt JPEG");
      } else {
         if (z->spec_start != 0) return stbi__err("bad SOS","Corrupt JPEG");
         if (z->succ_high != 0 || z->succ_low != 0) return stbi__err("bad SOS","Corrupt JPEG");
         z->spec_end = 63;
      }
   }

   return 1;
}